

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_PlayMontage(Task *__return_storage_ptr__,Montage montage)

{
  reference pvVar1;
  vector<float,_std::allocator<float>_> *this;
  float fVar2;
  value_type local_58;
  anon_class_1_0_00000001 local_4d [20];
  allocator<char> local_39;
  string local_38;
  undefined1 local_15;
  Montage local_14;
  Task *pTStack_10;
  Montage montage_local;
  Task *playMontage;
  
  local_15 = 0;
  local_14 = montage;
  pTStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"playMontage",&local_39);
  Task::Task(__return_storage_ptr__,&local_38,Simple);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  __return_storage_ptr__->action = PlayMontage;
  std::vector<float,_std::allocator<float>_>::resize(&(__return_storage_ptr__->parameters).values,3)
  ;
  std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::resize
            (&(__return_storage_ptr__->parameters).vectors,1);
  fVar2 = (float)(int)local_14;
  this = &(__return_storage_ptr__->parameters).values;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
  *pvVar1 = fVar2;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](this,1);
  *pvVar1 = 0.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](this,2);
  *pvVar1 = 0.0;
  std::function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)>::operator=
            ((function<void(AI::Task&,AI::WorldState&,AI::WorldQuerier_const&)> *)
             &__return_storage_ptr__->setup,local_4d);
  local_58.identifier = TimeElapsed;
  local_58.index = 0;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  push_back(&(__return_storage_ptr__->postconditions).satisfiedPredicates,&local_58);
  return __return_storage_ptr__;
}

Assistant:

Task create_PlayMontage(Montage montage)
	{
		Task playMontage {"playMontage"};		
		playMontage.action = Action::PlayMontage;
		playMontage.parameters.values.resize(3);
		playMontage.parameters.vectors.resize(1);
		playMontage.parameters.values[0] = static_cast<float>(montage);
		playMontage.parameters.values[1] = 0; //0 = needs to be started, 1 = already started
		playMontage.parameters.values[2] = 0; //elapsed time
		playMontage.setup = [](Task& task, const WorldState& state, const WorldQuerier&)
		{
			//parameters.vectors[0] is {current alarm time, total alarm time, UNUSED}
			task.parameters.vectors[0].x = 0;
			task.parameters.vectors[0].y = 1;
		};
		
		playMontage.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed, 0});

		return playMontage;
	}